

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::parseTriple(char **token,int vsize,int vnsize,int vtsize,vertex_index_t *ret)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  
  if (ret == (vertex_index_t *)0x0) {
    return false;
  }
  pcVar1 = *token;
  iVar3 = atoi(pcVar1);
  iVar5 = -1;
  iVar8 = iVar5;
  if ((iVar3 < 1) && (iVar8 = vsize, iVar3 == 0)) {
LAB_00e5cf71:
    bVar2 = false;
  }
  else {
    sVar7 = strcspn(pcVar1,"/ \t\r");
    pcVar9 = pcVar1 + sVar7;
    *token = pcVar9;
    iVar4 = iVar5;
    if (pcVar1[sVar7] == '/') {
      pcVar1 = pcVar9 + 1;
      *token = pcVar1;
      if (pcVar9[1] == '/') {
        pcVar9 = pcVar9 + 2;
        *token = pcVar9;
        iVar4 = atoi(pcVar9);
        iVar5 = -1;
        iVar6 = iVar5;
        if (iVar4 < 1) {
LAB_00e5cf3d:
          iVar6 = vnsize;
          if (iVar4 == 0) goto LAB_00e5cf71;
        }
LAB_00e5cf43:
        iVar4 = iVar4 + iVar6;
        sVar7 = strcspn(pcVar9,"/ \t\r");
        *token = pcVar9 + sVar7;
      }
      else {
        iVar5 = atoi(pcVar1);
        iVar4 = -1;
        iVar6 = iVar4;
        if ((iVar5 < 1) && (iVar6 = vtsize, iVar5 == 0)) goto LAB_00e5cf71;
        iVar5 = iVar5 + iVar6;
        sVar7 = strcspn(pcVar1,"/ \t\r");
        *token = pcVar1 + sVar7;
        if (pcVar1[sVar7] == '/') {
          pcVar9 = pcVar1 + sVar7 + 1;
          *token = pcVar9;
          iVar4 = atoi(pcVar9);
          if (iVar4 < 1) goto LAB_00e5cf3d;
          iVar6 = -1;
          goto LAB_00e5cf43;
        }
      }
    }
    ret->v_idx = iVar3 + iVar8;
    bVar2 = true;
    ret->vt_idx = iVar5;
    ret->vn_idx = iVar4;
  }
  return bVar2;
}

Assistant:

static bool parseTriple(const char **token, int vsize, int vnsize, int vtsize,
                        vertex_index_t *ret) {
  if (!ret) {
    return false;
  }

  vertex_index_t vi(-1);

  if (!fixIndex(atoi((*token)), vsize, &(vi.v_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }
  (*token)++;

  // i//k
  if ((*token)[0] == '/') {
    (*token)++;
    if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
      return false;
    }
    (*token) += strcspn((*token), "/ \t\r");
    (*ret) = vi;
    return true;
  }

  // i/j/k or i/j
  if (!fixIndex(atoi((*token)), vtsize, &(vi.vt_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }

  // i/j/k
  (*token)++;  // skip '/'
  if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
    return false;
  }
  (*token) += strcspn((*token), "/ \t\r");

  (*ret) = vi;

  return true;
}